

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::TestName::findFileName(string *__return_storage_ptr__,TestName *this,string *file)

{
  string newFileName;
  string local_30;
  
  checkParentDirectoriesForFile(&local_30,file);
  SystemUtils::checkFilenameCase(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TestName::findFileName(const std::string& file)
    {
        auto newFileName = checkParentDirectoriesForFile(file);
        return SystemUtils::checkFilenameCase(newFileName);
    }